

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O1

int Fraig_TableRehashF0(Fraig_Man_t *pMan,int fLinkEquiv)

{
  uint uVar1;
  Fraig_HashTable_t *pFVar2;
  ulong uVar3;
  Fraig_Node_t **__s;
  Fraig_Node_t *pFVar4;
  int iVar5;
  long lVar6;
  Fraig_Node_t *pFVar7;
  Fraig_Node_t *pFVar8;
  int iVar9;
  size_t __size;
  Fraig_Node_t *pFVar10;
  
  pFVar2 = pMan->pTableF0;
  __size = (long)pFVar2->nBins << 3;
  __s = (Fraig_Node_t **)malloc(__size);
  iVar9 = 0;
  memset(__s,0,__size);
  uVar1 = pFVar2->nBins;
  iVar5 = 0;
  if (0 < (long)(int)uVar1) {
    lVar6 = 0;
    iVar5 = 0;
    iVar9 = 0;
    do {
      pFVar8 = pFVar2->pBins[lVar6];
      if (pFVar8 != (Fraig_Node_t *)0x0) {
        pFVar10 = pFVar8->pNextF;
LAB_005ecb0c:
        pFVar7 = pFVar10;
        pFVar10 = pFVar8->pNextD;
        do {
          pFVar4 = pFVar10;
          uVar3 = (ulong)pFVar8->uHashD % (ulong)uVar1;
          if (fLinkEquiv == 0) {
LAB_005ecb53:
            pFVar8->pNextF = __s[uVar3];
            __s[uVar3] = pFVar8;
            pFVar8->pNextD = (Fraig_Node_t *)0x0;
            iVar5 = iVar5 + 1;
          }
          else {
            for (pFVar10 = __s[uVar3]; pFVar10 != (Fraig_Node_t *)0x0; pFVar10 = pFVar10->pNextF) {
              if (pFVar8->uHashD == pFVar10->uHashD) {
                pFVar8->pNextD = pFVar10->pNextD;
                pFVar10->pNextD = pFVar8;
                iVar5 = iVar5 + 1;
                iVar9 = 1;
                break;
              }
            }
            if (pFVar10 == (Fraig_Node_t *)0x0) goto LAB_005ecb53;
          }
          if (pFVar4 == (Fraig_Node_t *)0x0) goto code_r0x005ecb7e;
          pFVar10 = pFVar4->pNextD;
          pFVar8 = pFVar4;
        } while( true );
      }
LAB_005ecb9a:
      lVar6 = lVar6 + 1;
    } while (lVar6 != (int)uVar1);
  }
  if (iVar5 == pFVar2->nEntries) {
    if (pFVar2->pBins != (Fraig_Node_t **)0x0) {
      free(pFVar2->pBins);
      pFVar2->pBins = (Fraig_Node_t **)0x0;
    }
    pFVar2->pBins = __s;
    return iVar9;
  }
  __assert_fail("Counter == pT->nEntries",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigTable.c"
                ,0x28b,"int Fraig_TableRehashF0(Fraig_Man_t *, int)");
code_r0x005ecb7e:
  if (pFVar7 == (Fraig_Node_t *)0x0) goto LAB_005ecb9a;
  pFVar10 = pFVar7->pNextF;
  pFVar8 = pFVar7;
  goto LAB_005ecb0c;
}

Assistant:

int Fraig_TableRehashF0( Fraig_Man_t * pMan, int fLinkEquiv )
{
    Fraig_HashTable_t * pT = pMan->pTableF0;
    Fraig_Node_t ** pBinsNew;
    Fraig_Node_t * pEntF, * pEntF2, * pEnt, * pEntD2, * pEntN;
    int ReturnValue, Counter, i;
    unsigned Key;

    // allocate a new array of bins
    pBinsNew = ABC_ALLOC( Fraig_Node_t *, pT->nBins );
    memset( pBinsNew, 0, sizeof(Fraig_Node_t *) * pT->nBins );

    // rehash the entries in the table
    // go through all the nodes in the F-lists (and possible in D-lists, if used)
    Counter = 0;
    ReturnValue = 0;
    for ( i = 0; i < pT->nBins; i++ )
        Fraig_TableBinForEachEntrySafeF( pT->pBins[i], pEntF, pEntF2 )
        Fraig_TableBinForEachEntrySafeD( pEntF, pEnt, pEntD2 )
        {
            // decide where to put entry pEnt
            Key = pEnt->uHashD % pT->nBins;
            if ( fLinkEquiv )
            {
                // go through the entries in the new bin
                Fraig_TableBinForEachEntryF( pBinsNew[Key], pEntN )
                {
                    // if they have different values skip
                    if ( pEnt->uHashD != pEntN->uHashD )
                        continue;
                    // they have the same hash value, add pEnt to the D-list pEnt3
                    pEnt->pNextD  = pEntN->pNextD;
                    pEntN->pNextD = pEnt;
                    ReturnValue = 1;
                    Counter++;
                    break;
                }
                if ( pEntN != NULL ) // already linked
                    continue;
                // we did not find equal entry
            }
            // link the new entry
            pEnt->pNextF  = pBinsNew[Key];
            pBinsNew[Key] = pEnt;
            pEnt->pNextD  = NULL;
            Counter++;
        }
    assert( Counter == pT->nEntries );
    // replace the table and the parameters
    ABC_FREE( pT->pBins );
    pT->pBins = pBinsNew;
    return ReturnValue;
}